

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnet.cc
# Opt level: O2

string * bdnet_inet_ntoa_abi_cxx11_(string *__return_storage_ptr__,in_addr in)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bd_sprintf(__return_storage_ptr__,"%u.%u.%u.%u",(ulong)(in.s_addr & 0xff),
             (ulong)(in.s_addr >> 8 & 0xff),(ulong)(in.s_addr >> 0x10 & 0xff),
             (ulong)(in.s_addr >> 0x18));
  return __return_storage_ptr__;
}

Assistant:

std::string bdnet_inet_ntoa(struct in_addr in) {
	std::string str;
	uint8_t *bytes = (uint8_t *) &(in.s_addr);
	bd_sprintf(str, "%u.%u.%u.%u", (int) bytes[0], (int) bytes[1], (int) bytes[2], (int) bytes[3]);
	return str;
}